

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * __thiscall Pathie::Path::expand(Path *__return_storage_ptr__,Path *this)

{
  string str;
  Path homepath;
  Path path;
  string local_50;
  Path local_30;
  
  Path(&path,this);
  if (*(this->m_path)._M_dataplus._M_p != '~') {
    pwd();
    absolute((Path *)&str,&path,&homepath);
    operator=(&path,(Path *)&str);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::string((string *)&str,(string *)&path);
  if (*str._M_dataplus._M_p == '~') {
    home();
    if ((str._M_dataplus._M_p[1] == '/') || (str._M_string_length == 1)) {
      std::__cxx11::string::replace((ulong)&str,0,(string *)0x1);
    }
    std::__cxx11::string::string((string *)&local_50,(string *)&str);
    Path(&local_30,&local_50);
    operator=(&path,&local_30);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  prune(__return_storage_ptr__,&path);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

Path Path::expand() const
{
  Path path(*this); // copy

  if (m_path[0] != '~')
    path = path.absolute();

  std::string str = path.str();
  if (str[0] == '~') {
    Path homepath = home();

    if (str[1] == '/' || str.length() == 1) {
      // User home requested
      str.replace(0, 1, homepath.m_path);
    }

    path = Path(str);
  }

  return path.prune();
}